

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorNext(unqlite_kv_cursor *pCursor)

{
  int rc;
  lhcell *pCell;
  lhash_kv_cursor *pCur;
  unqlite_kv_cursor *pCursor_local;
  
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    pCursor[2].pStore = (unqlite_kv_engine *)pCursor[2].pStore[0xc].pIo;
    if (pCursor[2].pStore == (unqlite_kv_engine *)0x0) {
      pCursor_local._4_4_ = lhCursorNextPage((lhash_kv_cursor *)pCursor);
    }
    else {
      pCursor_local._4_4_ = 0;
    }
  }
  else {
    pCursor_local._4_4_ = lhCursorNextPage((lhash_kv_cursor *)pCursor);
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorNext(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Load the cells of the next page  */
		rc = lhCursorNextPage(pCur);
		return rc;
	}
	pCell = pCur->pCell;
	pCur->pCell = pCell->pNext;
	if( pCur->pCell == 0 ){
		/* Load the cells of the next page  */
		rc = lhCursorNextPage(pCur);
		return rc;
	}
	return UNQLITE_OK;
}